

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O1

void golf_lightmap_section_finalize(golf_lightmap_section_t *section)

{
  sg_buffer sVar1;
  sg_buffer_desc desc;
  sg_buffer_desc local_68;
  
  local_68.wgpu_buffer = (void *)0x0;
  local_68._end_canary = 0;
  local_68._92_4_ = 0;
  local_68.mtl_buffers[1] = (void *)0x0;
  local_68.d3d11_buffer = (void *)0x0;
  local_68.gl_buffers[0] = 0;
  local_68.gl_buffers[1] = 0;
  local_68.mtl_buffers[0] = (void *)0x0;
  local_68.label = (char *)0x0;
  local_68._start_canary = 0;
  local_68._4_4_ = 0;
  local_68.size = 0;
  local_68.type = SG_BUFFERTYPE_VERTEXBUFFER;
  local_68.usage = _SG_USAGE_DEFAULT;
  local_68.data.ptr = (section->uvs).data;
  local_68.data.size = (long)(section->uvs).length << 3;
  sVar1 = sg_make_buffer(&local_68);
  (section->sg_uvs_buf).id = sVar1.id;
  return;
}

Assistant:

void golf_lightmap_section_finalize(golf_lightmap_section_t *section) {
    sg_buffer_desc desc = {
        .type = SG_BUFFERTYPE_VERTEXBUFFER,
        .data = {
            .size = sizeof(vec2) * section->uvs.length,
            .ptr = section->uvs.data,
        },
    };
    section->sg_uvs_buf = sg_make_buffer(&desc);
}